

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O2

void anon_unknown.dwarf_1049::sp
               (Array2D<Imf_2_5::Rgba> *px,int w,int h,float xc,float yc,float rc,float rd,float gn,
               float bl,float lm)

{
  ushort *puVar1;
  Rgba *pRVar2;
  float fVar3;
  long lVar4;
  int x;
  long lVar5;
  int y;
  Array2D<Imf_2_5::Rgba> *this;
  half *phVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  long local_80;
  
  this = px;
  fVar10 = floorf(xc - rc);
  fVar14 = 0.0;
  if (0.0 <= fVar10) {
    fVar14 = fVar10;
  }
  fVar11 = ceilf(xc + rc);
  fVar10 = (float)w + -1.0;
  if (fVar11 <= (float)w + -1.0) {
    fVar10 = fVar11;
  }
  fVar12 = floorf(yc - rc);
  fVar11 = 0.0;
  if (0.0 <= fVar12) {
    fVar11 = fVar12;
  }
  fVar13 = ceilf(yc + rc);
  fVar12 = (float)h + -1.0;
  if (fVar13 <= (float)h + -1.0) {
    fVar12 = fVar13;
  }
  lVar4 = (long)(int)fVar11;
  local_80 = lVar4 * 8;
  for (; lVar4 <= (int)fVar12; lVar4 = lVar4 + 1) {
    fVar11 = ((float)(int)lVar4 - yc) / rc;
    lVar5 = (long)(int)fVar14;
    lVar7 = (long)(int)fVar14 * 8 + 4;
    while( true ) {
      y = (int)this;
      if ((int)fVar10 < lVar5) break;
      fVar15 = ((float)(int)lVar5 - xc) / rc;
      fVar13 = SQRT(fVar15 * fVar15 + fVar11 * fVar11);
      if (fVar13 < 1.0) {
        uVar9 = -(uint)(rc + -1.0 < fVar13 * rc);
        fVar3 = (float)(~uVar9 & 0x3f800000 | (uint)(rc - fVar13 * rc) & uVar9);
        fVar13 = 1.0 - fVar13 * fVar13;
        if (fVar13 < 0.0) {
          fVar13 = sqrtf(fVar13);
        }
        else {
          fVar13 = SQRT(fVar13);
        }
        fVar13 = fVar13 * 0.7071 + fVar15 * 0.42426 + fVar11 * -0.56568;
        fVar15 = (float)(-(uint)(fVar13 < 0.0) & (uint)(fVar13 * -0.1) |
                        ~-(uint)(fVar13 < 0.0) & (uint)fVar13);
        fVar13 = pw(fVar15,y);
        fVar15 = fVar13 * 4.0 + fVar15;
        lVar8 = px->_sizeY * local_80;
        pRVar2 = px->_data;
        phVar6 = (half *)((long)pRVar2 + lVar7 + lVar8 + -4);
        fVar13 = 1.0 - fVar3;
        half::operator=(phVar6,*(float *)((long)&half::_toFloat + (ulong)phVar6->_h * 4) * fVar13 +
                               fVar15 * rd * lm * fVar3);
        puVar1 = (ushort *)((long)&(pRVar2->r)._h + lVar7 + lVar8);
        phVar6 = (half *)(puVar1 + -1);
        half::operator=(phVar6,*(float *)((long)&half::_toFloat + (ulong)phVar6->_h * 4) * fVar13 +
                               fVar15 * gn * lm * fVar3);
        half::operator=((half *)((long)&(pRVar2->r)._h + lVar7 + lVar8),
                        *(float *)((long)&half::_toFloat + (ulong)*puVar1 * 4) * fVar13 +
                        fVar15 * bl * lm * fVar3);
        this = (Array2D<Imf_2_5::Rgba> *)((long)&(pRVar2->g)._h + lVar7 + lVar8);
        half::operator=((half *)this,
                        1.0 - (1.0 - *(float *)((long)&half::_toFloat +
                                               (ulong)(ushort)this->_sizeX * 4)) * fVar13);
      }
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 8;
    }
    local_80 = local_80 + 8;
  }
  return;
}

Assistant:

void
sp (Array2D<Rgba> &px, int w, int h,
    float xc, float yc, float rc,
    float rd, float gn, float bl, float lm)
{
    int x1 = int (max ((float) floor (xc - rc),  0.0f));
    int x2 = int (min ((float) ceil  (xc + rc), w - 1.0f));
    int y1 = int (max ((float) floor (yc - rc),  0.0f));
    int y2 = int (min ((float) ceil  (yc + rc), h - 1.0f));

    for (int y = y1; y <= y2; ++y)
    {
	for (int x = x1; x <= x2; ++x)
	{
	    float xl = (x - xc) / rc;
	    float yl = (y - yc) / rc;
	    float r  = sqrt (xl * xl + yl * yl);

	    if (r >= 1)
		continue;

	    float a = 1;

	    if (r * rc > rc - 1)
		a = rc - r * rc;

	    float zl = sqrt (1 - r * r);
	    float dl = xl * 0.42426 - yl * 0.56568 + zl * 0.70710;

	    if (dl < 0)
		dl *= -0.1;

	    float hl = pw (dl, 50) * 4;
	    float dr = (dl + hl) * rd;
	    float dg = (dl + hl) * gn;
	    float db = (dl + hl) * bl;

	    Rgba &p = px[y][x];
	    p.r = p.r * (1 - a) + dr * lm * a;
	    p.g = p.g * (1 - a) + dg * lm * a;
	    p.b = p.b * (1 - a) + db * lm * a;
	    p.a = 1 - (1 - p.a) * (1 - a);
	}
    }
}